

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O3

void __thiscall
xray_re::xr_vbuf::load_ogf3(xr_vbuf *this,xr_reader *r,size_t n,ogf_vertex_format vf)

{
  uint16_t bone0;
  uint16_t bone1;
  uint uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  float *pfVar4;
  uint16_t *puVar5;
  uint8_t *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  finfluence *pfVar12;
  fvector3 *pfVar13;
  fvector2 *pfVar14;
  long lVar15;
  long lVar16;
  finfluence *pfVar17;
  size_t sVar18;
  
  if (vf == OGF3_VERTEXFORMAT_FVF_2L) {
    clear(this);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = n;
    uVar11 = SUB168(auVar9 * ZEXT816(0x24),0);
    if (SUB168(auVar9 * ZEXT816(0x24),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pfVar12 = (finfluence *)operator_new__(uVar11);
    if (n != 0) {
      pfVar17 = pfVar12;
      do {
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[0].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[0].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[1].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[1].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[2].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[2].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[3].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[3].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = 0;
        pfVar17 = pfVar17 + 1;
      } while (pfVar17 != pfVar12 + n);
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = n;
    this->m_influences = pfVar12;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar10 * ZEXT816(0xc),8) == 0) {
      uVar11 = SUB168(auVar10 * ZEXT816(0xc),0);
    }
    pfVar13 = (fvector3 *)operator_new__(uVar11);
    this->m_points = pfVar13;
    pfVar13 = (fvector3 *)operator_new__(uVar11);
    this->m_normals = pfVar13;
    pfVar14 = (fvector2 *)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
    this->m_texcoords = pfVar14;
    (this->super_xr_flexbuf).m_size = n;
    if (n != 0) {
      lVar15 = 8;
      lVar16 = 0;
      sVar18 = 0;
      do {
        puVar5 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
        bone0 = *puVar5;
        (r->field_2).m_p = (uint8_t *)(puVar5 + 2);
        bone1 = puVar5[1];
        pfVar13 = this->m_points;
        (r->field_2).m_p = (uint8_t *)(puVar5 + 4);
        *(undefined4 *)((long)pfVar13 + lVar15 + -8) = *(undefined4 *)(puVar5 + 2);
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)pfVar13 + lVar15 + -4) = *puVar3;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)&pfVar13->field_0 + lVar15) = *puVar3;
        pfVar13 = this->m_normals;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)pfVar13 + lVar15 + -8) = *puVar3;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)pfVar13 + lVar15 + -4) = *puVar3;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)&pfVar13->field_0 + lVar15) = *puVar3;
        puVar6 = (r->field_2).m_p;
        (r->field_2).m_p = puVar6 + 0x18;
        if (r->m_end < puVar6 + 0x18) {
          __assert_fail("m_p <= m_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                        ,0x7c,"void xray_re::xr_reader::advance(size_t)");
        }
        pfVar12 = this->m_influences;
        (r->field_2).m_p = puVar6 + 0x1c;
        _influence<unsigned_int,_float>::set_wo_reorder
                  ((_influence<unsigned_int,_float> *)
                   ((long)&(pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>)
                           .array[0].bone + lVar16),bone0,bone1,*(float *)(puVar6 + 0x18));
        pfVar14 = this->m_texcoords;
        pfVar4 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        pfVar14[sVar18].field_0.field_0.x = *pfVar4;
        pfVar4 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        pfVar14[sVar18].field_0.field_0.y = *pfVar4;
        sVar18 = sVar18 + 1;
        lVar16 = lVar16 + 0x24;
        lVar15 = lVar15 + 0xc;
      } while (n != sVar18);
    }
  }
  else {
    if (vf != OGF3_VERTEXFORMAT_FVF_1L) {
      load_d3d7(this,r,n,vf);
      return;
    }
    clear(this);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = n;
    uVar11 = SUB168(auVar7 * ZEXT816(0x24),0);
    if (SUB168(auVar7 * ZEXT816(0x24),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pfVar12 = (finfluence *)operator_new__(uVar11);
    if (n != 0) {
      pfVar17 = pfVar12;
      do {
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[0].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[0].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[1].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[1].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[2].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[2].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[3].bone = 0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[3].weight =
             1.0;
        (pfVar17->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = 0;
        pfVar17 = pfVar17 + 1;
      } while (pfVar17 != pfVar12 + n);
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = n;
    this->m_influences = pfVar12;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0xc),8) == 0) {
      uVar11 = SUB168(auVar8 * ZEXT816(0xc),0);
    }
    pfVar13 = (fvector3 *)operator_new__(uVar11);
    this->m_points = pfVar13;
    pfVar13 = (fvector3 *)operator_new__(uVar11);
    this->m_normals = pfVar13;
    pfVar14 = (fvector2 *)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
    this->m_texcoords = pfVar14;
    (this->super_xr_flexbuf).m_size = n;
    if (n != 0) {
      lVar15 = 8;
      lVar16 = 0;
      sVar18 = 0;
      do {
        pfVar13 = this->m_points;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)pfVar13 + lVar15 + -8) = *puVar3;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)pfVar13 + lVar15 + -4) = *puVar3;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)&pfVar13->field_0 + lVar15) = *puVar3;
        pfVar13 = this->m_normals;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)pfVar13 + lVar15 + -8) = *puVar3;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)pfVar13 + lVar15 + -4) = *puVar3;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        *(uint32_t *)((long)&pfVar13->field_0 + lVar15) = *puVar3;
        pfVar14 = this->m_texcoords;
        pfVar4 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        pfVar14[sVar18].field_0.field_0.x = *pfVar4;
        pfVar4 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        pfVar14[sVar18].field_0.field_0.y = *pfVar4;
        pfVar12 = this->m_influences;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        uVar1 = *(uint *)((long)((pfVar12->
                                 super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                                 array + 4) + lVar16);
        uVar11 = (ulong)uVar1;
        if (3 < uVar11) {
          __assert_fail("count < N",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_fixed_vector.h"
                        ,0x5b,
                        "void xray_re::_svector<xray_re::_bone_weight<unsigned int, float>, 4>::push_back(const T &) [T = xray_re::_bone_weight<unsigned int, float>, N = 4]"
                       );
        }
        uVar2 = *puVar3;
        *(uint *)((long)((pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                         array + 4) + lVar16) = uVar1 + 1;
        *(uint32_t *)
         ((long)&(pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array
                 [uVar11].bone + lVar16) = uVar2;
        *(undefined4 *)
         ((long)&(pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array
                 [uVar11].weight + lVar16) = 0x3f800000;
        sVar18 = sVar18 + 1;
        lVar16 = lVar16 + 0x24;
        lVar15 = lVar15 + 0xc;
      } while (n != sVar18);
    }
  }
  make_signature(this);
  return;
}

Assistant:

void xr_vbuf::load_ogf3(xr_reader& r, size_t n, ogf_vertex_format vf)
{
	if (vf == OGF3_VERTEXFORMAT_FVF_1L) {
		clear();
		m_influences = new finfluence[n];
		m_points = new fvector3[n];
		m_normals = new fvector3[n];
		m_texcoords = new fvector2[n];
		set_size(n);
		for (size_t i = 0; i != n; ++i) {
			r.r_fvector3(m_points[i]);
			r.r_fvector3(m_normals[i]);
			r.r_fvector2(m_texcoords[i]);
			m_influences[i].set(r.r_u32());
		}
		make_signature();
	} else if (vf == OGF3_VERTEXFORMAT_FVF_2L) {
		clear();
		m_influences = new finfluence[n];
		m_points = new fvector3[n];
		m_normals = new fvector3[n];
		m_texcoords = new fvector2[n];
		set_size(n);
		for (size_t i = 0; i != n; ++i) {
			uint16_t bone0 = r.r_u16();
			uint16_t bone1 = r.r_u16();
			r.r_fvector3(m_points[i]);
			r.r_fvector3(m_normals[i]);
			r.advance(2*sizeof(fvector3));	// skip tangent and binormal
			m_influences[i].set_wo_reorder(bone0, bone1, r.r_float());//set_wo_reorder ����� ��� �������������� ������
			r.r_fvector2(m_texcoords[i]);
		}
		make_signature();
	} else {
		load_d3d7(r, n, vf);
	}
}